

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O0

void __thiscall interfaces_tests::findAncestorByHeight::test_method(findAncestorByHeight *this)

{
  bool bVar1;
  int iVar2;
  pointer pCVar3;
  FoundBlock *pFVar4;
  long in_FS_OFFSET;
  CChain *active;
  unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *chain;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  uint256 hash;
  ChainstateManager *in_stack_fffffffffffffc68;
  lazy_ostream *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  CChain *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  lazy_ostream *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffca8;
  lazy_ostream local_258 [2];
  assertion_result local_238 [2];
  undefined1 local_1f0 [64];
  const_string local_1b0 [2];
  lazy_ostream local_190 [2];
  assertion_result local_170 [2];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_88 [32];
  lazy_ostream local_68 [2];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffca8,
             (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
             (int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffc68);
  ChainstateManager::GetMutex(in_stack_fffffffffffffc68);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffca8,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
             (char *)in_stack_fffffffffffffc98,
             (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc8c,SUB41((uint)in_stack_fffffffffffffc88 >> 0x18,0));
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffca8,
             (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
             (int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffc68);
  ChainstateManager::ActiveChain(in_stack_fffffffffffffc68);
  uint256::uint256((uint256 *)in_stack_fffffffffffffc68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78,
               (pointer)in_stack_fffffffffffffc70,(unsigned_long)in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffca8,
               (const_string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (size_t)in_stack_fffffffffffffc98,
               (const_string *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    pCVar3 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_fffffffffffffc68);
    CChain::operator[](in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffc78);
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_fffffffffffffc68);
    pFVar4 = interfaces::FoundBlock::hash
                       ((FoundBlock *)in_stack_fffffffffffffc78,(uint256 *)in_stack_fffffffffffffc70
                       );
    (*pCVar3->_vptr_Chain[0xc])(pCVar3,local_48,10,pFVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffc78,
               SUB81((ulong)in_stack_fffffffffffffc70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78,
               (pointer)in_stack_fffffffffffffc70,(unsigned_long)in_stack_fffffffffffffc68);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffc70,(basic_cstring<const_char> *)in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78,
               (pointer)in_stack_fffffffffffffc70,(unsigned_long)in_stack_fffffffffffffc68);
    in_stack_fffffffffffffc68 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_170,local_190,local_1b0,0x52,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78,
               (pointer)in_stack_fffffffffffffc70,(unsigned_long)in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffca8,
               (const_string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (size_t)in_stack_fffffffffffffc98,
               (const_string *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc70,(char (*) [1])in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78,
               (pointer)in_stack_fffffffffffffc70,(unsigned_long)in_stack_fffffffffffffc68);
    CChain::operator[](in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc78 = "active[10]->GetBlockHash()";
    in_stack_fffffffffffffc70 = local_68;
    in_stack_fffffffffffffc68 = (ChainstateManager *)0x1d1f252;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_1f0,&stack0xfffffffffffffe00,0x53,1,2,local_28);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78,
               (pointer)in_stack_fffffffffffffc70,(unsigned_long)in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffca8,
               (const_string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (size_t)in_stack_fffffffffffffc98,
               (const_string *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    in_stack_fffffffffffffca8 =
         (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
         std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                   ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                    in_stack_fffffffffffffc68);
    CChain::operator[](in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffc78);
    local_138 = 0;
    local_130 = 0;
    local_128 = 0;
    local_120 = 0;
    local_118 = 0;
    local_110 = 0;
    local_108 = 0;
    local_100 = 0;
    local_f8 = 0;
    local_f0 = 0;
    iVar2 = (**(_func_int **)
               ((long)&(in_stack_fffffffffffffca8->super_unique_lock)._M_device[2].
                       super___recursive_mutex_base._M_mutex + 0x10))
                      (in_stack_fffffffffffffca8,local_88,0x14,&local_138);
    in_stack_fffffffffffffca7 = (undefined1)iVar2;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffc78,
               SUB81((ulong)in_stack_fffffffffffffc70 >> 0x38,0));
    in_stack_fffffffffffffc98 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78,
               (pointer)in_stack_fffffffffffffc70,(unsigned_long)in_stack_fffffffffffffc68);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffc70,(basic_cstring<const_char> *)in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78,
               (pointer)in_stack_fffffffffffffc70,(unsigned_long)in_stack_fffffffffffffc68);
    in_stack_fffffffffffffc68 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_238,local_258,(const_string *)&stack0xfffffffffffffd88,0x54,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc68);
    in_stack_fffffffffffffc97 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc97);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffc68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(findAncestorByHeight)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();
    uint256 hash;
    BOOST_CHECK(chain->findAncestorByHeight(active[20]->GetBlockHash(), 10, FoundBlock().hash(hash)));
    BOOST_CHECK_EQUAL(hash, active[10]->GetBlockHash());
    BOOST_CHECK(!chain->findAncestorByHeight(active[10]->GetBlockHash(), 20));
}